

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintColumn(cmDocumentationFormatter *this,ostream *os,string *text)

{
  size_type sVar1;
  string *psVar2;
  char *ptr;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  char *local_48;
  char *r;
  char *l;
  ptrdiff_t column;
  ptrdiff_t width;
  bool firstLine;
  string *psStack_20;
  bool newSentence;
  string *text_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  width._7_1_ = 0;
  width._6_1_ = 1;
  psStack_20 = text;
  text_local = (string *)os;
  os_local = (ostream *)this;
  if (this->TextWidth <= this->TextIndent) {
    __assert_fail("this->TextIndent < this->TextWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDocumentationFormatter.cxx"
                  ,0x7d,
                  "void cmDocumentationFormatter::PrintColumn(std::ostream &, const std::string &) const"
                 );
  }
  column = this->TextWidth - this->TextIndent;
  l = (char *)0x0;
  r = (char *)std::__cxx11::string::c_str();
  ptr = (char *)std::__cxx11::string::c_str();
  local_48 = anon_unknown.dwarf_15a53bb::skipToSpace(ptr);
  while (psVar2 = text_local, *r != '\0') {
    if ((long)local_48 - (long)r < (long)((column - (long)l) - (ulong)(width._7_1_ & 1))) {
      if (r < local_48) {
        if (l == (char *)0x0) {
          if (((width._6_1_ & 1) == 0) && (this->TextIndent != 0)) {
            sVar1 = this->TextIndent;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_68,sVar1,' ',&local_69);
            std::operator<<((ostream *)psVar2,local_68);
            std::__cxx11::string::~string(local_68);
            std::allocator<char>::~allocator(&local_69);
          }
        }
        else {
          std::operator<<((ostream *)text_local,
                          "Resource spec file:\n\n  " + (ulong)((width._7_1_ ^ 0xff) & 1) + 0x15);
          l = l + (ulong)(width._7_1_ & 1) + 1;
        }
        std::ostream::write((char *)text_local,(long)r);
        width._7_1_ = local_48[-1] == '.';
      }
      if (*local_48 == '\n') {
        std::operator<<((ostream *)text_local,'\n');
        local_48 = local_48 + 1;
        l = (char *)0x0;
        width._6_1_ = 0;
      }
      else {
        l = l + ((long)local_48 - (long)r);
      }
    }
    else {
      std::operator<<((ostream *)text_local,'\n');
      psVar2 = text_local;
      width._6_1_ = 0;
      if (r < local_48) {
        sVar1 = this->TextIndent;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_a0,sVar1,' ',&local_a1);
        std::operator<<((ostream *)psVar2,local_a0);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator(&local_a1);
        std::ostream::write((char *)text_local,(long)r);
        l = local_48 + -(long)r;
        width._7_1_ = local_48[-1] == '.';
      }
      else {
        l = (char *)0x0;
      }
    }
    r = anon_unknown.dwarf_15a53bb::skipSpaces(local_48);
    local_48 = anon_unknown.dwarf_15a53bb::skipToSpace(r);
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintColumn(std::ostream& os,
                                           std::string const& text) const
{
  // Print text arranged in an indented column of fixed width.
  bool newSentence = false;
  bool firstLine = true;

  assert(this->TextIndent < this->TextWidth);
  const std::ptrdiff_t width = this->TextWidth - this->TextIndent;
  std::ptrdiff_t column = 0;

  // Loop until the end of the text.
  for (const char *l = text.c_str(), *r = skipToSpace(text.c_str()); *l;
       l = skipSpaces(r), r = skipToSpace(l)) {
    // Does it fit on this line?
    if (r - l < width - column - std::ptrdiff_t(newSentence)) {
      // Word fits on this line.
      if (r > l) {
        if (column) {
          // Not first word on line.  Separate from the previous word
          // by a space, or two if this is a new sentence.
          os << &("  "[std::size_t(!newSentence)]);
          column += 1u + std::ptrdiff_t(newSentence);
        } else if (!firstLine && this->TextIndent) {
          // First word on line.  Print indentation unless this is the
          // first line.
          os << std::string(this->TextIndent, ' ');
        }

        // Print the word.
        os.write(l, r - l);
        newSentence = (*(r - 1) == '.');
      }

      if (*r == '\n') {
        // Text provided a newline.  Start a new line.
        os << '\n';
        ++r;
        column = 0;
        firstLine = false;
      } else {
        // No provided newline.  Continue this line.
        column += r - l;
      }
    } else {
      // Word does not fit on this line.  Start a new line.
      os << '\n';
      firstLine = false;
      if (r > l) {
        os << std::string(this->TextIndent, ' ');
        os.write(l, r - l);
        column = r - l;
        newSentence = (*(r - 1) == '.');
      } else {
        column = 0;
      }
    }
    // Move to beginning of next word.  Skip over whitespace.
  }
}